

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::blend_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          uint64_t source_alpha)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong g;
  ulong b;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  uint64_t da;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  uint64_t sa;
  long local_b0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  long local_80;
  long local_78;
  ulong local_70;
  Image *local_68;
  long local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar1 = source->width;
  if (w < 0) {
    w = lVar1;
  }
  lVar2 = source->height;
  if (h < 0) {
    h = lVar2;
  }
  uVar7 = sx >> 0x3f & sx;
  local_60 = x - uVar7;
  lVar4 = 0;
  if (sx < 1) {
    sx = lVar4;
  }
  uVar8 = sy >> 0x3f & sy;
  local_78 = y - uVar8;
  if (sy < 1) {
    sy = lVar4;
  }
  lVar5 = 0;
  if (0 < local_60) {
    lVar5 = local_60;
  }
  if (-1 < local_60) {
    local_60 = lVar4;
  }
  uVar7 = uVar7 + w + local_60;
  local_60 = sx - local_60;
  local_80 = 0;
  if (0 < local_78) {
    local_80 = local_78;
  }
  if (-1 < local_78) {
    local_78 = lVar4;
  }
  uVar9 = uVar8 + h + local_78;
  local_78 = sy - local_78;
  uVar8 = lVar1 - local_60;
  if ((long)(uVar7 + local_60) <= lVar1) {
    uVar8 = uVar7;
  }
  uVar7 = lVar2 - local_78;
  if ((long)(uVar9 + local_78) <= lVar2) {
    uVar7 = uVar9;
  }
  uVar9 = this->width - lVar5;
  if ((long)(uVar8 + lVar5) <= this->width) {
    uVar9 = uVar8;
  }
  local_70 = this->height - local_80;
  if ((long)(uVar7 + local_80) <= this->height) {
    local_70 = uVar7;
  }
  if (0 < (long)local_70 && -1 < (long)(local_70 | uVar9)) {
    local_b0 = 0;
    local_68 = source;
    do {
      if (0 < (long)uVar9) {
        lVar1 = local_b0 + local_78;
        lVar2 = local_b0 + local_80;
        lVar4 = 0;
        do {
          read_pixel(source,local_60 + lVar4,lVar1,&local_88,&local_90,&local_98,&local_38);
          uVar7 = this->max_value;
          uVar3 = (local_38 * source_alpha) / uVar7;
          uVar8 = local_88;
          g = local_90;
          b = local_98;
          if (uVar3 == uVar7) {
LAB_00113980:
            write_pixel(this,lVar5 + lVar4,lVar2,uVar8,g,b,uVar7);
          }
          else if (uVar7 <= local_38 * source_alpha) {
            read_pixel(this,lVar5 + lVar4,lVar2,&local_40,&local_48,&local_50,&local_58);
            uVar7 = this->max_value;
            lVar6 = uVar7 - uVar3;
            uVar8 = (local_40 * lVar6 + local_88 * uVar3) / uVar7;
            g = (local_48 * lVar6 + local_90 * uVar3) / uVar7;
            b = (lVar6 * local_50 + local_98 * uVar3) / uVar7;
            source = local_68;
            uVar7 = local_58;
            goto LAB_00113980;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < (long)uVar9);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 < (long)local_70);
  }
  return;
}

Assistant:

void Image::blend_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, uint64_t source_alpha) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t sr, sg, sb, sa;
      source.read_pixel(sx + xx, sy + yy, &sr, &sg, &sb, &sa);

      uint64_t effective_alpha = (source_alpha * sa) / this->max_value;
      if (effective_alpha == this->max_value) {
        this->write_pixel(x + xx, y + yy, sr, sg, sb, effective_alpha);
      } else if (effective_alpha != 0x00) {
        uint64_t dr, dg, db, da;
        this->read_pixel(x + xx, y + yy, &dr, &dg, &db, &da);
        this->write_pixel(x + xx, y + yy,
            (sr * effective_alpha + dr * (this->max_value - effective_alpha)) / this->max_value,
            (sg * effective_alpha + dg * (this->max_value - effective_alpha)) / this->max_value,
            (sb * effective_alpha + db * (this->max_value - effective_alpha)) / this->max_value,
            da);
      }
    }
  }
}